

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cc
# Opt level: O3

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall FileFactory::ReadFile(FileFactory *this,string *filename)

{
  long *plVar1;
  ifstream *this_00;
  long in_FS_OFFSET;
  
  plVar1 = *(long **)(in_FS_OFFSET + -8);
  if (plVar1 == (long *)0x0) {
    this_00 = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(this_00,(string *)filename,_S_in);
    (this->super_ThreadCapture<FileFactory>)._vptr_ThreadCapture = (_func_int **)this_00;
  }
  else {
    (**(code **)(*plVar1 + 0x10))(this,plVar1,filename);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<std::istream> ReadFile(const std::string& filename) {
    if (GetCurrent()) {
      return GetCurrent()->GetReadStream(filename);
    } else {
      return std::unique_ptr<std::istream>(new std::ifstream(filename));
    }
  }